

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  int iVar1;
  int in_EDX;
  LexState *in_RSI;
  long in_RDI;
  int nexps;
  LHS_assign nv;
  expdesc e;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  LexState *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  FuncState *in_stack_ffffffffffffffc0;
  expdesc *in_stack_ffffffffffffffc8;
  FuncState *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  LexState *ls_00;
  
  if (((uint)in_RSI->lastline < 6) || (9 < (uint)in_RSI->lastline)) {
    luaX_syntaxerror(in_stack_ffffffffffffffb0,
                     (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  iVar1 = testnext((LexState *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  if (iVar1 == 0) {
    checknext(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    iVar1 = explist1(in_stack_ffffffffffffffb0,
                     (expdesc *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (iVar1 == in_EDX) {
      luaK_setoneret(*(FuncState **)(in_RDI + 0x30),(expdesc *)&stack0xffffffffffffffd0);
      luaK_storevar(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                    (expdesc *)in_stack_ffffffffffffffc0);
      return;
    }
    adjust_assign((LexState *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                  in_stack_ffffffffffffffb8,(expdesc *)in_stack_ffffffffffffffb0);
    if (in_EDX < iVar1) {
      *(int *)(*(long *)(in_RDI + 0x30) + 0x3c) =
           *(int *)(*(long *)(in_RDI + 0x30) + 0x3c) - (iVar1 - in_EDX);
    }
  }
  else {
    ls_00 = in_RSI;
    primaryexp(in_RSI,(expdesc *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    if (in_stack_ffffffffffffffb8 == 6) {
      check_conflict((LexState *)in_stack_ffffffffffffffc0,
                     (LHS_assign *)CONCAT44(in_stack_ffffffffffffffbc,6),(expdesc *)in_RSI);
    }
    if ((int)(200 - (uint)*(ushort *)(*(long *)(in_RDI + 0x38) + 0x60)) < in_EDX) {
      errorlimit(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(char *)in_RSI);
    }
    assignment(ls_00,(LHS_assign *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               in_stack_ffffffffffffffe4);
  }
  init_exp((expdesc *)&stack0xffffffffffffffd0,VNONRELOC,
           *(int *)(*(long *)(in_RDI + 0x30) + 0x3c) + -1);
  luaK_storevar(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                (expdesc *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

static void assignment(LexState*ls,struct LHS_assign*lh,int nvars){
expdesc e;
check_condition(ls,VLOCAL<=lh->v.k&&lh->v.k<=VINDEXED,
"syntax error");
if(testnext(ls,',')){
struct LHS_assign nv;
nv.prev=lh;
primaryexp(ls,&nv.v);
if(nv.v.k==VLOCAL)
check_conflict(ls,lh,&nv.v);
luaY_checklimit(ls->fs,nvars,200-ls->L->nCcalls,
"variables in assignment");
assignment(ls,&nv,nvars+1);
}
else{
int nexps;
checknext(ls,'=');
nexps=explist1(ls,&e);
if(nexps!=nvars){
adjust_assign(ls,nvars,nexps,&e);
if(nexps>nvars)
ls->fs->freereg-=nexps-nvars;
}
else{
luaK_setoneret(ls->fs,&e);
luaK_storevar(ls->fs,&lh->v,&e);
return;
}
}
init_exp(&e,VNONRELOC,ls->fs->freereg-1);
luaK_storevar(ls->fs,&lh->v,&e);
}